

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O1

int __thiscall mario::EPoller::poll(EPoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  epoll_event *__events;
  uint msg;
  Timestamp TVar1;
  Writer *pWVar2;
  long lVar3;
  Writer local_a0;
  
  __events = (epoll_event *)
             (this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
             super__Vector_impl_data._M_start;
  msg = epoll_wait(this->_epollfd,__events,
                   (int)((ulong)((long)(this->_events).
                                       super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)__events)
                        >> 2) * -0x55555555,(int)__fds);
  TVar1 = Timestamp::now();
  if ((int)msg < 1) {
    if (msg == 0) {
      local_a0._vptr_Writer = (_func_int **)&PTR__Writer_00134af0;
      local_a0.m_msg = (LogMessage *)0x0;
      local_a0.m_level = Info;
      local_a0.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
      ;
      local_a0.m_line = 0x2c;
      local_a0.m_func = "Timestamp mario::EPoller::poll(int, ChannelList *)";
      local_a0.m_verboseLevel = 0;
      local_a0.m_logger = (Logger *)0x0;
      local_a0.m_proceed = false;
      local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
      local_a0.m_messageBuilder.m_containerLogSeperator = "";
      local_a0.m_dispatchAction = NormalLog;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar2 = el::base::Writer::construct(&local_a0,1,"default");
      if (pWVar2->m_proceed == true) {
        el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,"nothing happended");
      }
    }
    else {
      local_a0._vptr_Writer = (_func_int **)&PTR__Writer_00134af0;
      local_a0.m_msg = (LogMessage *)0x0;
      local_a0.m_level = Fatal;
      local_a0.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
      ;
      local_a0.m_line = 0x2e;
      local_a0.m_func = "Timestamp mario::EPoller::poll(int, ChannelList *)";
      local_a0.m_verboseLevel = 0;
      local_a0.m_logger = (Logger *)0x0;
      local_a0.m_proceed = false;
      local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
      local_a0.m_messageBuilder.m_containerLogSeperator = "";
      local_a0.m_dispatchAction = NormalLog;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar2 = el::base::Writer::construct(&local_a0,1,"default");
      if (pWVar2->m_proceed == true) {
        el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,"EPoller::poll()");
      }
    }
    el::base::Writer::~Writer(&local_a0);
  }
  else {
    local_a0._vptr_Writer = (_func_int **)&PTR__Writer_00134af0;
    local_a0.m_msg = (LogMessage *)0x0;
    local_a0.m_level = Info;
    local_a0.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
    ;
    local_a0.m_line = 0x26;
    local_a0.m_func = "Timestamp mario::EPoller::poll(int, ChannelList *)";
    local_a0.m_verboseLevel = 0;
    local_a0.m_logger = (Logger *)0x0;
    local_a0.m_proceed = false;
    local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
    local_a0.m_messageBuilder.m_containerLogSeperator = "";
    local_a0.m_dispatchAction = NormalLog;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_a0,1,"default");
    if (pWVar2->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,msg);
    }
    if (pWVar2->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,"events happended");
    }
    el::base::Writer::~Writer(&local_a0);
    fillActiveChannels(this,msg,(ChannelList *)__nfds);
    lVar3 = (long)(this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2;
    if (lVar3 * -0x5555555555555555 - (ulong)msg == 0) {
      std::vector<epoll_event,_std::allocator<epoll_event>_>::resize
                (&this->_events,lVar3 * 0x5555555555555556);
    }
  }
  return (int)TVar1._microSecondsSinceEpoch;
}

Assistant:

Timestamp EPoller::poll(int timeoutMs, ChannelList* activeChannels) {
    int numEvents = ::epoll_wait(_epollfd,
            _events.data(),
            _events.size(),
            timeoutMs);
    Timestamp now(Timestamp::now());
    if (numEvents > 0) {
        LOG(INFO) << numEvents << "events happended";
        fillActiveChannels(numEvents, activeChannels);
        if (numEvents == _events.size()) {
            _events.resize(_events.size() * 2);
        }
    } else if (numEvents == 0) {
        LOG(INFO) << "nothing happended";
    } else {
        LOG(FATAL) << "EPoller::poll()";
    }
    return now;
}